

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O1

void __thiscall aiMaterial::Clear(aiMaterial *this)

{
  aiMaterialProperty *paVar1;
  ulong uVar2;
  
  if (this->mNumProperties != 0) {
    uVar2 = 0;
    do {
      paVar1 = this->mProperties[uVar2];
      if (paVar1 != (aiMaterialProperty *)0x0) {
        if (paVar1->mData != (char *)0x0) {
          operator_delete__(paVar1->mData);
        }
        paVar1->mData = (char *)0x0;
        operator_delete(paVar1,0x420);
      }
      this->mProperties[uVar2] = (aiMaterialProperty *)0x0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->mNumProperties);
  }
  this->mNumProperties = 0;
  return;
}

Assistant:

void aiMaterial::Clear()
{
    for ( unsigned int i = 0; i < mNumProperties; ++i )    {
        // delete this entry
        delete mProperties[ i ];
        AI_DEBUG_INVALIDATE_PTR(mProperties[i]);
    }
    mNumProperties = 0;

    // The array remains allocated, we just invalidated its contents
}